

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

JavascriptString *
Js::JavascriptNumber::ToStringNanOrInfiniteOrZero(double value,ScriptContext *scriptContext)

{
  JavascriptString *pJVar1;
  
  pJVar1 = ToStringNanOrInfinite(value,scriptContext);
  if (pJVar1 == (JavascriptString *)0x0) {
    if ((value == 0.0) && (!NAN(value))) {
      pJVar1 = CharStringCache::GetStringForCharA
                         (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                           charStringCache,'0');
      return pJVar1;
    }
    pJVar1 = (JavascriptString *)0x0;
  }
  return pJVar1;
}

Assistant:

JavascriptString* JavascriptNumber::ToStringNanOrInfiniteOrZero(double value, ScriptContext* scriptContext)
    {
        JavascriptString* nanF;
        if (nullptr != (nanF = ToStringNanOrInfinite(value, scriptContext)))
        {
            return nanF;
        }

        if (IsZero(value))
        {
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForCharA('0');
        }

        return nullptr;
    }